

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O2

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  float fVar1;
  mixed_channel_t c;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_f5;
  float local_f4;
  undefined8 local_f0;
  float local_e8;
  float local_e0;
  float local_dc;
  byte local_d8 [48];
  float local_a8 [34];
  
  local_e0 = source->min_distance;
  fVar6 = source->max_distance;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)source->location;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)data->location;
  auVar7 = vsubps_avx(auVar7,auVar8);
  local_f0 = vmovlps_avx(auVar7);
  local_e8 = source->location[2] - data->location[2];
  fVar1 = auVar7._0_4_;
  auVar10._0_4_ = fVar1 * fVar1;
  auVar10._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar10._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar10._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar7 = vmovshdup_avx(auVar10);
  auVar7 = ZEXT416((uint)(local_e8 * local_e8 + fVar1 * fVar1 + auVar7._0_4_));
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  auVar7 = vminss_avx(auVar7,ZEXT416((uint)fVar6));
  local_f4 = auVar7._0_4_;
  local_dc = 1.0;
  if ((local_e0 < local_f4) && (local_e0 < fVar6)) {
    local_dc = (*data->attenuation)(local_e0,fVar6,local_f4,source->rolloff);
  }
  if (source->spatial == true) {
    vec_mul((float *)&local_f0,data->look_at,(float *)&local_f0);
    if (local_f4 < local_e0) {
      fVar6 = 1.0 - local_f4 / local_e0;
      auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar6 + fVar6)));
      fVar5 = auVar7._0_4_;
      fVar1 = 1.0 - fVar5;
      fVar6 = fVar5 * 0.0;
      auVar9._0_4_ = (float)local_f0 * fVar1 + fVar6;
      auVar9._4_4_ = (float)((ulong)local_f0 >> 0x20) * fVar1 + fVar6;
      auVar9._8_4_ = fVar1 * 0.0 + fVar6;
      auVar9._12_4_ = fVar1 * 0.0 + fVar6;
      local_f0 = vmovlps_avx(auVar9);
      local_e8 = fVar1 * local_e8 + fVar5;
    }
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f5,&data->vbap);
    uVar4 = (uint)local_f5;
    for (uVar2 = 0; local_f5 != uVar2; uVar2 = uVar2 + 1) {
      auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(local_dc * local_a8[uVar2]))
                         );
      local_a8[uVar2] = auVar7._0_4_;
    }
    if ((local_e0 < local_f4) && (data->surround == false)) {
      fVar6 = calculate_phase((float *)&local_f0);
      if (fVar6 < 0.0) {
        for (uVar2 = 0; local_f5 != uVar2; uVar2 = uVar2 + 1) {
          uVar3 = (ulong)(data->channels).positions[local_d8[uVar2]];
          if ((uVar3 < 0x21) && ((0x122020202U >> (uVar3 & 0x3f) & 1) != 0)) {
            local_a8[uVar2] = -local_a8[uVar2];
          }
        }
      }
    }
  }
  else {
    local_f0 = 0;
    local_e8 = 0.0;
    mixed_compute_gains_resolver(&local_f0,local_a8,local_d8,&local_f5,&data->vbap);
    uVar4 = (uint)local_f5;
    for (uVar2 = 0; local_f5 != uVar2; uVar2 = uVar2 + 1) {
      auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(local_dc * local_a8[uVar2]))
                         );
      local_a8[uVar2] = auVar7._0_4_;
    }
  }
  memcpy(source->volumes,local_a8,(ulong)(uVar4 << 2));
  memcpy(source->speakers,local_d8,(ulong)(uVar4 << 2));
  source->speaker_count = local_f5;
  return;
}

Assistant:

VECTORIZE static inline void calculate_volumes(float *lvolume, float *rvolume, struct plane_source *source, struct plane_mixer_data *data){
  float min_dist = source->min_distance;
  float max_dist = source->max_distance;
  float roll = source->rolloff;
  float div = data->volume;
  float *src = source->location;
  float *dst = data->location;
  float distance = clamp(min_dist, dist(src, dst), max_dist);
  float volume = div * data->attenuation(min_dist, max_dist, distance, roll);
  float xdiff = src[0]-dst[0];
  float xdist = fabs(xdiff);
  float pan = (xdist <= min_dist)
    ? 0.0
    : copysignf((min(max_dist,xdist)-min_dist)/(max_dist-min_dist), xdiff);
  *lvolume = volume * ((0.0<pan)?(1.0f-pan):1.0f);
  *rvolume = volume * ((pan<0.0)?(1.0f+pan):1.0f);
}